

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void usageMessage(ostream *stream,char *program_name,bool verbose)

{
  ostream *poVar1;
  byte in_DL;
  char *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"Usage: ");
  poVar1 = std::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1," [commands] infile outfile");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if ((in_DL & 1) != 0) {
    std::operator<<(in_RDI,
                    "\nRead OpenEXR image file infile, set the values of one\nor more attributes in the headers of the file, and save\nthe result in outfile.  Infile and outfile must not refer\nto the same file (the program cannot edit an image file \"in place\").\n\nCommand for selecting headers:\n\n  -part i\n        If i is greater than or equal to zero, and less\n        than the number of parts in the input file, then\n        the header for part i becomes \"current.\" If i\n        is \"any\" or -1, then all headers become current.\n        Subsequent attribute setting commands affect only\n        the current header or headers.  All headers are\n        current before the first -part command.\n\n        For example, the command sequence\n\n         -focus 3 -part 2 -aperture 8 -expTime 0.01 -part any -owner luke\n\n        sets the focus and owner attributes in all\n        headers, as well as the aperture and expTime\n        attributes in the header of part 2.\n\nCommands for setting attribute values:\n\n  -chromaticities f f f f f f f f\n        CIE xy chromaticities for the red, green\n        and blue primaries, and for the white point\n        (8 floats)\n\n  -whiteLuminance f\n        white luminance, in candelas per square meter\n        (float, >= 0.0)\n\n  -adoptedNeutral f f\n        CIE xy coordinates that should be considered\n        \"neutral\" during color rendering.  Pixels in\n        the image file whose xy coordinates match the\n        adoptedNeutral value should be mapped to neutral\n        values on the display. (2 floats)\n\n  -renderingTransform s\n        name of the CTL rendering transform for this\n        image (string)\n\n  -lookModTransform s\n        name of the CTL look modification transform for\n        this image (string)\n\n  -xDensity f\n        horizontal output density, in pixels per inch\n        (float, >= 0.0)\n\n  -owner s\n        name of the owner of the image (string)\n\n  -comments s\n        additional information about the image (string)\n\n  -capDate s\n        date when the image was created or\n        captured, in local time (string,\n        ..." /* TRUNCATED STRING LITERAL */
                   );
  }
  return;
}

Assistant:

void
usageMessage (ostream& stream, const char* program_name, bool verbose = false)
{
    stream << "Usage: " << program_name << " [commands] infile outfile" << endl;

    if (verbose)
        stream << "\n"
            "Read OpenEXR image file infile, set the values of one\n"
            "or more attributes in the headers of the file, and save\n"
            "the result in outfile.  Infile and outfile must not refer\n"
            "to the same file (the program cannot edit an image file "
            "\"in place\").\n"
            "\n"
            "Command for selecting headers:\n"
            "\n"
            "  -part i\n"
            "        If i is greater than or equal to zero, and less\n"
            "        than the number of parts in the input file, then\n"
            "        the header for part i becomes \"current.\" If i\n"
            "        is \"any\" or -1, then all headers become current.\n"
            "        Subsequent attribute setting commands affect only\n"
            "        the current header or headers.  All headers are\n"
            "        current before the first -part command.\n"
            "\n"
            "        For example, the command sequence\n"
            "\n"
            "         -focus 3 -part 2 -aperture 8 -expTime 0.01 "
            "-part any -owner luke\n"
            "\n"
            "        sets the focus and owner attributes in all\n"
            "        headers, as well as the aperture and expTime\n"
            "        attributes in the header of part 2.\n"
            "\n"
            "Commands for setting attribute values:\n"
            "\n"
            "  -chromaticities f f f f f f f f\n"
            "        CIE xy chromaticities for the red, green\n"
            "        and blue primaries, and for the white point\n"
            "        (8 floats)\n"
            "\n"
            "  -whiteLuminance f\n"
            "        white luminance, in candelas per square meter\n"
            "        (float, >= 0.0)\n"
            "\n"
            "  -adoptedNeutral f f\n"
            "        CIE xy coordinates that should be considered\n"
            "        \"neutral\" during color rendering.  Pixels in\n"
            "        the image file whose xy coordinates match the\n"
            "        adoptedNeutral value should be mapped to neutral\n"
            "        values on the display. (2 floats)\n"
            "\n"
            "  -renderingTransform s\n"
            "        name of the CTL rendering transform for this\n"
            "        image (string)\n"
            "\n"
            "  -lookModTransform s\n"
            "        name of the CTL look modification transform for\n"
            "        this image (string)\n"
            "\n"
            "  -xDensity f\n"
            "        horizontal output density, in pixels per inch\n"
            "        (float, >= 0.0)\n"
            "\n"
            "  -owner s\n"
            "        name of the owner of the image (string)\n"
            "\n"
            "  -comments s\n"
            "        additional information about the image (string)\n"
            "\n"
            "  -capDate s\n"
            "        date when the image was created or\n"
            "        captured, in local time (string,\n"
            "        formatted as YYYY:MM:DD hh:mm:ss)\n"
            "\n"
            "  -utcOffset f\n"
            "        offset of local time at capDate from UTC, in\n"
            "        seconds (float, UTC == local time + x)\n"
            "\n"
            "  -longitude f\n"
            "  -latitude f\n"
            "  -altitude f\n"
            "        location where the image was recorded, in\n"
            "        degrees east of Greenwich and north of the\n"
            "        equator, and in meters above sea level\n"
            "        (float)\n"
            "\n"
            "  -focus f\n"
            "        the camera's focus distance, in meters\n"
            "        (float, > 0, or \"infinity\")\n"
            "\n"
            "  -expTime f\n"
            "        exposure time, in seconds (float, >= 0)\n"
            "\n"
            "  -aperture f\n"
            "        lens apterture, in f-stops (float, >= 0)\n"
            "\n"
            "  -isoSpeed f\n"
            "        effective speed of the film or image\n"
            "        sensor that was used to record the image\n"
            "        (float, >= 0)\n"
            "\n"
            "  -envmap s\n"
            "        indicates that the image is an environment map\n"
            "        (string, LATLONG or CUBE)\n"
            "\n"
            "  -framesPerSecond i i\n"
            "        playback frame rate expressed as a ratio of two\n"
            "        integers, n and d (the frame rate is n/d frames\n"
            "        per second)\n"
            "\n"
            "  -keyCode i i i i i i i\n"
            "        key code that uniquely identifies a motion\n"
            "        picture film frame using 7 integers:\n"
            "         * film manufacturer code (0 - 99)\n"
            "         * film type code (0 - 99)\n"
            "         * prefix to identify film roll (0 - 999999)\n"
            "         * count, increments once every perfsPerCount\n"
            "           perforations (0 - 9999)\n"
            "         * offset of frame, in perforations from\n"
            "           zero-frame reference mark (0 - 119)\n"
            "         * number of perforations per frame (1 - 15)\n"
            "         * number of perforations per count (20 - 120)\n"
            "\n"
            "  -timeCode i i\n"
            "        SMPTE time and control code, specified as a pair\n"
            "        of 8-digit base-16 integers.  The first number\n"
            "        contains the time address and flags (drop frame,\n"
            "        color frame, field/phase, bgf0, bgf1, bgf2).\n"
            "        The second number contains the user data and\n"
            "        control codes.\n"
            "\n"
            "  -wrapmodes s\n"
            "        if the image is used as a texture map, specifies\n"
            "        how the image should be extrapolated outside the\n"
            "        zero-to-one texture coordinate range\n"
            "        (string, e.g. \"clamp\" or \"periodic,clamp\")\n"
            "\n"
            "  -pixelAspectRatio f\n"
            "        width divided by height of a pixel\n"
            "        (float, >= 0)\n"
            "\n"
            "  -screenWindowWidth f\n"
            "        width of the screen window (float, >= 0)\n"
            "\n"
            "  -screenWindowCenter f f\n"
            "        center of the screen window (2 floats)\n"
            "\n"
            "  -string s s\n"
            "        custom string attribute\n"
            "        (2 strings, attribute name and value)\n"
            "\n"
            "  -float s f\n"
            "        custom float attribute (string + float,\n"
            "        attribute name and value)\n"
            "\n"
            "  -int s i\n"
            "        custom integer attribute (string + integer,\n"
            "        attribute name and value)\n"
            "\n"
            "Other options:\n"
            "\n"
            "  -h, --help    print this message\n"
            "      --version print version information\n"
            "\n"
            "Report bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
            "";
}